

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall spdlog::details::scoped_padder::pad_it(scoped_padder *this,long count)

{
  char *begin;
  char *buf_ptr;
  
  begin = (this->spaces_).data_;
  fmt::v6::internal::buffer<char>::append<char>
            (&this->dest_->super_buffer<char>,begin,begin + count);
  return;
}

Assistant:

void pad_it(long count)
    {
        fmt_helper::append_string_view(string_view_t(spaces_.data(), static_cast<size_t>(count)), dest_);
    }